

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

bool __thiscall
crnlib::dxt1_endpoint_optimizer::try_median4
          (dxt1_endpoint_optimizer *this,vec3F *low_color,vec3F *high_color)

{
  int iVar1;
  undefined1 auVar2 [16];
  uint16 uVar3;
  int iVar4;
  bool bVar5;
  unsigned_short temp;
  uint uVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_EAX;
  ulong uVar9;
  long lVar10;
  uchar uVar11;
  uint i;
  ulong uVar12;
  uint uVar13;
  vec3F *lhs;
  vec3F *pvVar14;
  long lVar15;
  long lVar16;
  vec<3U,_float> *pvVar17;
  byte bVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_124;
  dxt1_endpoint_optimizer *local_120;
  fast_random rm;
  float local_108;
  dxt1_solution_coordinates sc;
  float new_weights [4];
  vec3F new_means [4];
  vec3F means [4];
  
  local_120 = this;
  if ((this->m_unique_colors).m_size < 5) {
    pvVar14 = means;
    for (uVar12 = 0; uVar12 != 4; uVar12 = uVar12 + 1) {
      uVar6 = (this->m_norm_unique_colors).m_size - 1;
      uVar9 = (ulong)uVar6;
      if ((int)uVar12 <= (int)uVar6) {
        uVar9 = uVar12 & 0xffffffff;
      }
      vec<3U,_float>::operator=(pvVar14,(this->m_norm_unique_colors).m_p + uVar9);
      pvVar14 = pvVar14 + 1;
    }
  }
  else {
    pvVar14 = &this->m_mean_norm_color;
    operator-(low_color,pvVar14);
    vec<3U,_float>::operator=(means,new_means);
    this = local_120;
    operator-(high_color,pvVar14);
    pvVar17 = means + 3;
    vec<3U,_float>::operator=(pvVar17,new_means);
    vec<3U,_float>::lerp(means,pvVar17,0.33333334);
    vec<3U,_float>::operator=(means + 1,new_means);
    vec<3U,_float>::lerp(means,pvVar17,0.6666667);
    vec<3U,_float>::operator=(means + 2,new_means);
    fast_random::fast_random(&rm);
    iVar1 = 0;
    fVar21 = 1e+37;
    for (iVar7 = 0; iVar7 != 8; iVar7 = iVar7 + 1) {
      new_means[0].m_s[0] = 0.0;
      new_means[0].m_s[1] = 0.0;
      new_means[0].m_s[2] = 0.0;
      new_means[1].m_s[0] = 0.0;
      new_means[1].m_s[1] = 0.0;
      new_means[1].m_s[2] = 0.0;
      new_means[2].m_s[0] = 0.0;
      new_means[2].m_s[1] = 0.0;
      new_means[2].m_s[2] = 0.0;
      new_means[3].m_s[0] = 0.0;
      new_means[3].m_s[1] = 0.0;
      new_means[3].m_s[2] = 0.0;
      new_weights[0] = 0.0;
      new_weights[1] = 0.0;
      new_weights[2] = 0.0;
      new_weights[3] = 0.0;
      local_108 = 0.0;
      for (uVar12 = 0; uVar12 < (this->m_unique_colors).m_size; uVar12 = uVar12 + 1) {
        pvVar17 = (this->m_norm_unique_colors).m_p + uVar12;
        fVar20 = vec<3U,_float>::squared_distance(means,pvVar17);
        iVar19 = 0;
        pvVar14 = means;
        for (lVar16 = -3; this = local_120, pvVar14 = pvVar14 + 1, lVar16 != 0; lVar16 = lVar16 + 1)
        {
          fVar24 = vec<3U,_float>::squared_distance(pvVar14,pvVar17);
          iVar4 = (int)lVar16 + 4;
          if (fVar20 <= fVar24) {
            fVar24 = fVar20;
            iVar4 = iVar19;
          }
          iVar19 = iVar4;
          fVar20 = fVar24;
        }
        local_108 = local_108 + fVar20;
        operator*(pvVar17,(float)(local_120->m_unique_colors).m_p[uVar12].m_weight);
        vec<3U,_float>::operator+=(new_means + iVar19,(vec<3U,_float> *)&sc);
        new_weights[iVar19] =
             (float)(this->m_unique_colors).m_p[uVar12].m_weight + new_weights[iVar19];
      }
      fVar20 = 0.0;
      pvVar14 = means;
      lhs = new_means;
      uVar9 = 0;
      bVar5 = false;
      for (uVar12 = 0; this = local_120, uVar12 != 4; uVar12 = uVar12 + 1) {
        fVar24 = new_weights[uVar12];
        if (fVar24 <= 0.0) {
          bVar5 = true;
        }
        else {
          operator/(lhs,fVar24);
          vec<3U,_float>::operator=(pvVar14,(vec<3U,_float> *)&sc);
          if (fVar20 < fVar24) {
            uVar9 = uVar12 & 0xffffffff;
            fVar20 = fVar24;
          }
        }
        lhs = lhs + 1;
        pvVar14 = pvVar14 + 1;
      }
      if (bVar5) {
        if (iVar7 == 7) {
          local_108 = 1e+37;
        }
        else {
          pvVar14 = means;
          for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
            if ((new_weights[lVar16] == 0.0) && (!NAN(new_weights[lVar16]))) {
              vec<3U,_float>::operator=(pvVar14,means + ((int)uVar9 + iVar1 & 3));
              vec<3U,_float>::make_random((vec<3U,_float> *)&sc,&rm,-0.00196,0.00196);
              vec<3U,_float>::operator+=(pvVar14,(vec<3U,_float> *)&sc);
            }
            pvVar14 = pvVar14 + 1;
          }
          iVar1 = iVar1 + 1;
          local_108 = 1e+37;
        }
      }
      else if (ABS(local_108 - fVar21) < 1e-05) break;
      fVar21 = local_108;
    }
  }
  pvVar14 = &this->m_mean_norm_color;
  lVar16 = 0xc;
  bVar18 = 0;
  lVar10 = 0;
  while (lVar10 != 3) {
    for (lVar15 = lVar16; lVar15 != 0x30; lVar15 = lVar15 + 0xc) {
      operator+(means + lVar10,pvVar14);
      operator+((vec<3U,_float> *)((long)means[0].m_s + lVar15),pvVar14);
      fVar21 = new_means[0].m_s[1];
      fVar20 = floorf(new_means[0].m_s[0] * 31.0 + 0.5);
      uVar13 = (uint)fVar20;
      fVar21 = floorf(fVar21 * 63.0 + 0.5);
      uVar8 = (uint)fVar21;
      uVar6 = 0xff;
      if (uVar13 < 0xff) {
        uVar6 = uVar13;
      }
      rm.jsr._0_1_ = (char)uVar6;
      if ((int)uVar13 < 0) {
        rm.jsr._0_1_ = 0;
      }
      uVar6 = 0xff;
      if (uVar8 < 0xff) {
        uVar6 = uVar8;
      }
      rm.jsr._1_1_ = (char)uVar6;
      if ((int)uVar8 < 0) {
        rm.jsr._1_1_ = 0;
      }
      rm.jsr._3_1_ = 0xff;
      fVar24 = new_weights[0] * 31.0;
      fVar25 = new_weights[1] * 63.0;
      fVar20 = new_weights[2] * 31.0;
      fVar21 = floorf(new_means[0].m_s[2] * 31.0 + 0.5);
      fVar20 = floorf(fVar20 + 0.5);
      fVar24 = floorf(fVar24 + 0.5);
      fVar25 = floorf(fVar25 + 0.5);
      uVar8 = (uint)fVar24;
      uVar13 = (uint)fVar25;
      uVar22 = (uint)fVar20;
      uVar23 = (uint)fVar21;
      uVar6 = uVar23;
      if (0xfe < uVar23) {
        uVar6 = 0xff;
      }
      auVar2._4_4_ = uVar13;
      auVar2._0_4_ = uVar8;
      auVar2._8_4_ = uVar22;
      auVar2._12_4_ = uVar23;
      uVar23 = movmskps(extraout_EAX,auVar2);
      uVar11 = '\0';
      rm.jsr._2_1_ = (uchar)uVar6;
      if ((uVar23 & 8) != 0) {
        rm.jsr._2_1_ = uVar11;
      }
      if (0xfe < uVar8) {
        uVar8 = 0xff;
      }
      local_124.field_0.r = (uchar)uVar8;
      if ((uVar23 & 1) != 0) {
        local_124.field_0.r = uVar11;
      }
      if (0xfe < uVar13) {
        uVar13 = 0xff;
      }
      local_124.field_0.g = (uchar)uVar13;
      if ((uVar23 & 2) != 0) {
        local_124.field_0.g = uVar11;
      }
      if (0xfe < uVar22) {
        uVar22 = 0xff;
      }
      local_124.field_0.b = (uchar)uVar22;
      if ((uVar23 & 4) != 0) {
        local_124.field_0.b = '\0';
      }
      local_124.field_0.a = 0xff;
      dxt1_solution_coordinates::dxt1_solution_coordinates
                (&sc,(color_quad_u8 *)&rm,(color_quad_u8 *)&local_124.field_0,false);
      uVar3 = sc.m_low_color;
      this = local_120;
      if (sc.m_low_color < sc.m_high_color) {
        sc.m_low_color = sc.m_high_color;
        sc.m_high_color = uVar3;
      }
      bVar5 = evaluate_solution(local_120,&sc,false);
      bVar18 = bVar18 | bVar5;
    }
    lVar16 = lVar16 + 0xc;
    lVar10 = lVar10 + 1;
  }
  bVar5 = refine_solution(this,(uint)(this->m_pParams->m_quality == cCRNDXTQualityUber));
  return (bool)(bVar5 | bVar18);
}

Assistant:

bool dxt1_endpoint_optimizer::try_median4(const vec3F& low_color, const vec3F& high_color) {
  vec3F means[4];

  if (m_unique_colors.size() <= 4) {
    for (uint i = 0; i < 4; i++)
      means[i] = m_norm_unique_colors[math::minimum<int>(m_norm_unique_colors.size() - 1, i)];
  } else {
    means[0] = low_color - m_mean_norm_color;
    means[3] = high_color - m_mean_norm_color;
    means[1] = vec3F::lerp(means[0], means[3], 1.0f / 3.0f);
    means[2] = vec3F::lerp(means[0], means[3], 2.0f / 3.0f);

    fast_random rm;

    const uint cMaxIters = 8;
    uint reassign_rover = 0;
    float prev_total_dist = math::cNearlyInfinite;
    for (uint iter = 0; iter < cMaxIters; iter++) {
      vec3F new_means[4];
      float new_weights[4];
      utils::zero_object(new_means);
      utils::zero_object(new_weights);

      float total_dist = 0;

      for (uint i = 0; i < m_unique_colors.size(); i++) {
        const vec3F& v = m_norm_unique_colors[i];

        float best_dist = means[0].squared_distance(v);
        int best_index = 0;

        for (uint j = 1; j < 4; j++) {
          float dist = means[j].squared_distance(v);
          if (dist < best_dist) {
            best_dist = dist;
            best_index = j;
          }
        }

        total_dist += best_dist;

        new_means[best_index] += v * (float)m_unique_colors[i].m_weight;
        new_weights[best_index] += (float)m_unique_colors[i].m_weight;
      }

      uint highest_index = 0;
      float highest_weight = 0;
      bool empty_cell = false;
      for (uint j = 0; j < 4; j++) {
        if (new_weights[j] > 0.0f) {
          means[j] = new_means[j] / new_weights[j];
          if (new_weights[j] > highest_weight) {
            highest_weight = new_weights[j];
            highest_index = j;
          }
        } else
          empty_cell = true;
      }

      if (!empty_cell) {
        if (fabs(total_dist - prev_total_dist) < .00001f)
          break;

        prev_total_dist = total_dist;
      } else
        prev_total_dist = math::cNearlyInfinite;

      if ((empty_cell) && (iter != (cMaxIters - 1))) {
        const uint ri = (highest_index + reassign_rover) & 3;
        reassign_rover++;

        for (uint j = 0; j < 4; j++) {
          if (new_weights[j] == 0.0f) {
            means[j] = means[ri];
            means[j] += vec3F::make_random(rm, -.00196f, .00196f);
          }
        }
      }
    }
  }

  bool improved = false;

  for (uint i = 0; i < 3; i++) {
    for (uint j = i + 1; j < 4; j++) {
      const vec3F v0(means[i] + m_mean_norm_color);
      const vec3F v1(means[j] + m_mean_norm_color);

      dxt1_solution_coordinates sc(
          color_quad_u8((int)floor(.5f + v0[0] * 31.0f), (int)floor(.5f + v0[1] * 63.0f), (int)floor(.5f + v0[2] * 31.0f), 255),
          color_quad_u8((int)floor(.5f + v1[0] * 31.0f), (int)floor(.5f + v1[1] * 63.0f), (int)floor(.5f + v1[2] * 31.0f), 255), false);

      sc.canonicalize();
      improved |= evaluate_solution(sc);
    }
  }

  improved |= refine_solution((m_pParams->m_quality == cCRNDXTQualityUber) ? 1 : 0);

  return improved;
}